

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_imexgus.c
# Opt level: O0

SUNErrCode
SUNAdaptController_EstimateStep_ImExGus
          (SUNAdaptController C,sunrealtype h,int p,sunrealtype dsm,sunrealtype *hnew)

{
  int iVar1;
  double *in_RDX;
  int in_ESI;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double __y;
  double __y_00;
  double __y_01;
  double __x;
  double __x_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  sunrealtype hrat;
  sunrealtype e2;
  sunrealtype e1;
  sunrealtype k2i;
  sunrealtype k1i;
  sunrealtype k2e;
  sunrealtype k1e;
  sunrealtype e;
  sunrealtype k;
  int ord;
  SUNContext_conflict sunctx_local_scope_;
  undefined8 local_b8;
  
  iVar1 = in_ESI + 1;
  if (*(int *)(*in_RDI + 0x38) == 0) {
    __y = -*(double *)(*in_RDI + 0x10) / (double)iVar1;
    __y_00 = -*(double *)(*in_RDI + 0x18) / (double)iVar1;
    dVar2 = *(double *)*in_RDI;
    __y_01 = -*(double *)(*in_RDI + 8) / (double)iVar1;
    __x = *(double *)(*in_RDI + 0x20) * in_XMM1_Qa;
    __x_00 = __x / *(double *)(*in_RDI + 0x28);
    dVar3 = in_XMM0_Qa / *(double *)(*in_RDI + 0x30);
    dVar4 = pow(__x,-dVar2 / (double)iVar1);
    dVar5 = pow(__x_00,__y_01);
    dVar6 = pow(__x,__y);
    dVar7 = pow(__x_00,__y_00);
    if (dVar6 * dVar7 <= dVar3 * dVar4 * dVar5) {
      local_b8 = pow(__x,__y);
      dVar2 = pow(__x_00,__y_00);
      local_b8 = local_b8 * dVar2;
    }
    else {
      dVar2 = pow(__x,-dVar2 / (double)iVar1);
      local_b8 = pow(__x_00,__y_01);
      local_b8 = dVar3 * dVar2 * local_b8;
    }
    *in_RDX = in_XMM0_Qa * local_b8;
  }
  else {
    dVar2 = pow(*(double *)(*in_RDI + 0x20) * in_XMM1_Qa,-1.0 / (double)iVar1);
    *in_RDX = in_XMM0_Qa * dVar2;
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_EstimateStep_ImExGus(SUNAdaptController C,
                                                   sunrealtype h, int p,
                                                   sunrealtype dsm,
                                                   sunrealtype* hnew)
{
  SUNFunctionBegin(C->sunctx);

  /* order parameter to use */
  const int ord = p + 1;

  /* compute estimated time step size, modifying the first step formula */
  if (SACIMEXGUS_FIRSTSTEP(C))
  {
    /* set usable time-step adaptivity parameters -- first step */
    const sunrealtype k = -SUN_RCONST(1.0) / ord;
    const sunrealtype e = SACIMEXGUS_BIAS(C) * dsm;
    *hnew               = h * SUNRpowerR(e, k);
  }
  else
  {
    /* set usable time-step adaptivity parameters -- subsequent steps */
    const sunrealtype k1e  = -SACIMEXGUS_K1E(C) / ord;
    const sunrealtype k2e  = -SACIMEXGUS_K2E(C) / ord;
    const sunrealtype k1i  = -SACIMEXGUS_K1I(C) / ord;
    const sunrealtype k2i  = -SACIMEXGUS_K2I(C) / ord;
    const sunrealtype e1   = SACIMEXGUS_BIAS(C) * dsm;
    const sunrealtype e2   = e1 / SACIMEXGUS_EP(C);
    const sunrealtype hrat = h / SACIMEXGUS_HP(C);
    *hnew = h * SUNMIN(hrat * SUNRpowerR(e1, k1i) * SUNRpowerR(e2, k2i),
                       SUNRpowerR(e1, k1e) * SUNRpowerR(e2, k2e));
  }

  /* return with success */
  return SUN_SUCCESS;
}